

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TagImport::~TagImport(TagImport *this)

{
  TagImport *this_local;
  
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__TagImport_004036e8;
  Tag::~Tag(&this->tag);
  ImportMixin<(wabt::ExternalKind)4>::~ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)4>);
  return;
}

Assistant:

explicit TagImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Tag>(), tag(name) {}